

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall cmNinjaNormalTargetGenerator::WriteLinkStatement(cmNinjaNormalTargetGenerator *this)

{
  cmOutputConverter *this_00;
  cmNinjaDeps *__x;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_01;
  pointer pcVar2;
  cmOSXBundleGenerator *pcVar3;
  cmMakefile *this_02;
  cmGeneratorTarget *pcVar4;
  cmLocalNinjaGenerator *this_03;
  cmLocalNinjaGenerator *pcVar5;
  size_type sVar6;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  TargetType targetType;
  int iVar11;
  TargetType TVar12;
  string *psVar13;
  cmGlobalNinjaGenerator *pcVar14;
  cmGeneratedFileStream *pcVar15;
  char *pcVar16;
  size_t sVar17;
  ostream *poVar18;
  string *psVar19;
  mapped_type *pmVar20;
  undefined4 extraout_var;
  mapped_type *flags;
  mapped_type *linkFlags;
  char *__s;
  long *plVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar22;
  MapToNinjaPathImpl __unary_op;
  ModuleDefinitionInfo *source;
  size_t sVar23;
  mapped_type_conflict *pmVar24;
  cmGlobalNinjaGenerator *pcVar25;
  size_type *psVar26;
  size_type sVar27;
  long lVar28;
  cmOutputConverter *pcVar29;
  pointer ppcVar30;
  pointer pbVar31;
  pointer cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  pointer pbVar33;
  string objPath;
  bool usedResponseFile;
  string obj_list_file;
  cmNinjaDeps objs;
  string rspfile;
  allocator_type local_729;
  string lwyuFlags;
  string postBuildCmdLine;
  key_type local_6c8;
  cmNinjaVars vars;
  string cfgName;
  string targetOutputReal;
  string targetOutput;
  cmNinjaVars symlinkVars;
  cmNinjaDeps symlinks;
  cmNinjaDeps byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  preLinkCmdLines;
  undefined1 local_348 [32];
  string linkPath;
  string frameworkPath;
  cmNinjaDeps emptyDeps;
  string createRule;
  string targetOutputImplib;
  cmNinjaDeps outputs;
  cmNinjaDeps explicitDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmdLineLists [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postBuildCmdLines;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdLists [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  cmNinjaDeps implicitDeps;
  cmNinjaDeps orderOnlyDeps;
  ostringstream comment;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  cmLinkLineComputer *this_04;
  
  this_01 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar13 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  cfgName._M_dataplus._M_p = (pointer)&cfgName.field_2;
  pcVar2 = (psVar13->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&cfgName,pcVar2,pcVar2 + psVar13->_M_string_length);
  cmGeneratorTarget::GetFullPath
            ((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact,false);
  pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutput,pcVar14,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmGeneratorTarget::GetFullPath((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact,true)
  ;
  pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutputReal,pcVar14,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmGeneratorTarget::GetFullPath
            ((string *)&symlinkVars,this_01,&cfgName,ImportLibraryArtifact,false);
  pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&targetOutputImplib,pcVar14,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  bVar9 = cmGeneratorTarget::IsAppBundleOnApple(this_01);
  if (bVar9) {
    cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact);
    cmOSXBundleGenerator::CreateAppBundle
              ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,&this->TargetNameOut,
               (string *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)&targetOutput);
    std::__cxx11::string::append((char *)&targetOutput);
    std::__cxx11::string::_M_append
              ((char *)&targetOutput,(ulong)(this->TargetNameOut)._M_dataplus._M_p);
    pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath((string *)&comment,pcVar14,&targetOutput);
    std::__cxx11::string::operator=((string *)&targetOutput,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_198) {
      operator_delete(_comment,local_198[0]._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&targetOutputReal);
    std::__cxx11::string::append((char *)&targetOutputReal);
    std::__cxx11::string::_M_append
              ((char *)&targetOutputReal,(ulong)(this->TargetNameReal)._M_dataplus._M_p);
    pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::ConvertToNinjaPath((string *)&comment,pcVar14,&targetOutputReal);
    std::__cxx11::string::operator=((string *)&targetOutputReal,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_comment != local_198) {
      operator_delete(_comment,local_198[0]._M_allocated_capacity + 1);
    }
LAB_0036cbc4:
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  else {
    bVar9 = cmGeneratorTarget::IsFrameworkOnApple(this_01);
    if (bVar9) {
      pcVar3 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact)
      ;
      cmOSXBundleGenerator::CreateFramework(pcVar3,&this->TargetNameOut,(string *)&symlinkVars);
      goto LAB_0036cbc4;
    }
    bVar9 = cmGeneratorTarget::IsCFBundleOnApple(this_01);
    if (bVar9) {
      pcVar3 = (this->super_cmNinjaTargetGenerator).OSXBundleGenerator;
      cmGeneratorTarget::GetDirectory((string *)&symlinkVars,this_01,&cfgName,RuntimeBinaryArtifact)
      ;
      cmOSXBundleGenerator::CreateCFBundle(pcVar3,&this->TargetNameOut,(string *)&symlinkVars);
      goto LAB_0036cbc4;
    }
  }
  pcVar15 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteDivider((ostream *)pcVar15);
  targetType = cmGeneratorTarget::GetType(this_01);
  pcVar15 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar15,"# Link build statements for ",0x1c);
  pcVar16 = cmState::GetTargetTypeName(targetType);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)pcVar15 +
                    (int)(pcVar15->super_ofstream).
                         super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3])
    ;
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar15,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar15," target ",8);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)&symlinkVars,&this->super_cmNinjaTargetGenerator);
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pcVar15,(char *)symlinkVars._M_t._M_impl._0_8_,
                       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n\n",2);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  emptyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&comment);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,"Link the ",9);
  pcVar16 = GetVisibleTypeName(this);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)&objPath + (int)*(undefined8 *)(_comment + -0x18) + 0x620);
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&comment," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&comment,targetOutputReal._M_dataplus._M_p,targetOutputReal._M_string_length
            );
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&targetOutputReal);
  __x = &(this->super_cmNinjaTargetGenerator).Objects;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explicitDeps,__x);
  cmNinjaTargetGenerator::ComputeLinkDeps_abi_cxx11_
            (&implicitDeps,&this->super_cmNinjaTargetGenerator);
  if ((this->DeviceLinkObject)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&explicitDeps,&this->DeviceLinkObject);
  }
  this_02 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkPath.field_2._M_local_buf[0] = '\0';
  pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  psVar19 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  psVar13 = &this->TargetLinkLanguage;
  cmGeneratorTarget::GetCreateRuleVariable(&createRule,pcVar4,psVar13,psVar19);
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&symlinkVars,createRule._M_dataplus._M_p,
             createRule._M_dataplus._M_p + createRule._M_string_length);
  std::__cxx11::string::append((char *)&symlinkVars);
  bVar9 = cmMakefile::IsOn(this_02,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  this_03 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  this_00 = &(this_03->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,&targetOutputReal,SHELL);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"TARGET_FILE","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar29 = &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar5 == (cmLocalNinjaGenerator *)0x0) {
    pcVar29 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&lwyuFlags,(cmLocalGenerator *)pcVar5);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&symlinkVars,(cmStateSnapshot *)&lwyuFlags);
  iVar11 = (*(pcVar14->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
             _vptr_cmGlobalGenerator[0xc])(pcVar14,pcVar29,&symlinkVars);
  this_04 = (cmLinkLineComputer *)CONCAT44(extraout_var,iVar11);
  cmLinkLineComputer::SetUseWatcomQuote(this_04,bVar9);
  psVar19 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_LIBRARIES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"FLAGS","");
  flags = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](&vars,&lwyuFlags);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_FLAGS","");
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
  cmLocalGenerator::GetTargetFlags
            ((cmLocalGenerator *)this_03,this_04,psVar19,pmVar20,flags,linkFlags,&frameworkPath,
             &linkPath,pcVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  TVar12 = cmGeneratorTarget::GetType
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  if ((TVar12 == SHARED_LIBRARY) ||
     (TVar12 = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget), TVar12 == MODULE_LIBRARY)) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar20,psVar13,"COMPATIBILITY",true);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    cmCommonTargetGenerator::AppendOSXVerFlag
              ((cmCommonTargetGenerator *)this,pmVar20,psVar13,"CURRENT",false);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"JOB_POOL_LINK","");
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars,this_01,&vars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,(key_type *)&symlinkVars);
  cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,this_04,pmVar20);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"LINK_FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  cmGlobalNinjaGenerator::EncodeLiteral((string *)&symlinkVars,pmVar20);
  objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LINK_FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&objPath);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  cmCommonTargetGenerator::GetManifests_abi_cxx11_
            ((string *)&symlinkVars,(cmCommonTargetGenerator *)this);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"MANIFESTS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars,
                 &frameworkPath,&linkPath);
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lwyuFlags,"LINK_PATH","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&lwyuFlags);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  lwyuFlags._M_dataplus._M_p = (pointer)&lwyuFlags.field_2;
  lwyuFlags._M_string_length = 0;
  lwyuFlags.field_2._M_local_buf[0] = '\0';
  symlinkVars._M_t._M_impl._0_8_ =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_WHAT_YOU_USE","");
  bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,(string *)&symlinkVars);
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (bVar9) {
    std::__cxx11::string::_M_replace
              ((ulong)&lwyuFlags,0,(char *)lwyuFlags._M_string_length,0x57676a);
  }
  if (targetType == EXECUTABLE) {
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar2 = (pmVar20->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&symlinkVars,pcVar2,pcVar2 + pmVar20->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)this_03,(string *)&symlinkVars,pcVar4,psVar13,&cfgName);
    std::__cxx11::string::_M_append((char *)&symlinkVars,(ulong)lwyuFlags._M_dataplus._M_p);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar20);
  }
  else {
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    pcVar2 = (pmVar20->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&symlinkVars,pcVar2,pcVar2 + pmVar20->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    cmLocalGenerator::AddArchitectureFlags
              ((cmLocalGenerator *)this_03,(string *)&symlinkVars,pcVar4,psVar13,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"ARCH_FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&symlinkVars,0,
               (char *)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,0x5944aa);
    std::__cxx11::string::_M_append((char *)&symlinkVars,(ulong)lwyuFlags._M_dataplus._M_p);
    cmLocalGenerator::AddLanguageFlagsForLinking
              ((cmLocalGenerator *)this_03,(string *)&symlinkVars,pcVar4,psVar13,&cfgName);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"LANGUAGE_COMPILE_FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar20);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  bVar9 = cmGeneratorTarget::HasSOName
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,&cfgName);
  if (bVar9) {
    __s = cmMakefile::GetSONameFlag(this_02,psVar13);
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"SONAME_FLAG","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    pcVar16 = (char *)pmVar20->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)pmVar20,0,pcVar16,(ulong)__s);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"SONAME","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if (targetType == SHARED_LIBRARY) {
      cmGeneratorTarget::GetInstallNameDirForBuildTree
                ((string *)&symlinkVars,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 &cfgName);
      if (symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
        cmOutputConverter::ConvertToOutputFormat(&objPath,this_00,(string *)&symlinkVars,SHELL);
        postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&postBuildCmdLine,"INSTALLNAME_DIR","");
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&vars,&postBuildCmdLine);
        std::__cxx11::string::operator=((string *)pmVar20,(string *)&objPath);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
          operator_delete(postBuildCmdLine._M_dataplus._M_p,
                          CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                                   postBuildCmdLine.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)objPath._M_dataplus._M_p != &objPath.field_2) {
          operator_delete(objPath._M_dataplus._M_p,
                          CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                                   objPath.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
          &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                        (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
    }
  }
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  byproducts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->TargetNameImport)._M_string_length != 0) {
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,this_00,&targetOutputImplib,SHELL);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&objPath,"TARGET_IMPLIB","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&objPath);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)&symlinkVars);
    bVar9 = cmGeneratorTarget::HasImportLibrary(pcVar4);
    if (bVar9) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&byproducts,&targetOutputImplib);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  bVar9 = cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
                    (&this->super_cmNinjaTargetGenerator,&vars);
  if (!bVar9) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         ((ulong)symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
         0xffffffffffffff00);
    objPath._M_dataplus._M_p = (pointer)&objPath.field_2;
    objPath._M_string_length = 0;
    objPath.field_2._M_local_buf[0] = '\0';
    postBuildCmdLine._M_string_length = 0;
    postBuildCmdLine.field_2._M_local_buf[0] = '\0';
    pcVar4 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    paVar32 = &rspfile.field_2;
    rspfile._M_dataplus._M_p = (pointer)paVar32;
    postBuildCmdLine._M_dataplus._M_p = (pointer)&postBuildCmdLine.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"");
    cmGeneratorTarget::GetFullNameComponents
              (pcVar4,(string *)&symlinkVars,&objPath,&postBuildCmdLine,&rspfile,
               RuntimeBinaryArtifact);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar32) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    rspfile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,".dbg","");
    paVar1 = &obj_list_file.field_2;
    obj_list_file._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&obj_list_file,"CMAKE_DEBUG_SYMBOL_SUFFIX","");
    pcVar16 = cmMakefile::GetDefinition(this_02,&obj_list_file);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_list_file._M_dataplus._M_p != paVar1) {
      operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1
                     );
    }
    if (pcVar16 != (char *)0x0) {
      obj_list_file._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&obj_list_file,"CMAKE_DEBUG_SYMBOL_SUFFIX","");
      pcVar16 = cmMakefile::GetDefinition(this_02,&obj_list_file);
      strlen(pcVar16);
      std::__cxx11::string::_M_replace
                ((ulong)&rspfile,0,(char *)rspfile._M_string_length,(ulong)pcVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != paVar1) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                   &objPath,&postBuildCmdLine);
    plVar21 = (long *)std::__cxx11::string::_M_append((char *)&objs,(ulong)rspfile._M_dataplus._M_p)
    ;
    psVar26 = (size_type *)(plVar21 + 2);
    if ((size_type *)*plVar21 == psVar26) {
      obj_list_file.field_2._M_allocated_capacity = *psVar26;
      obj_list_file.field_2._8_8_ = plVar21[3];
      obj_list_file._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      obj_list_file.field_2._M_allocated_capacity = *psVar26;
      obj_list_file._M_dataplus._M_p = (pointer)*plVar21;
    }
    obj_list_file._M_string_length = plVar21[1];
    *plVar21 = (long)psVar26;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"TARGET_PDB","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&local_6c8);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&obj_list_file);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_list_file._M_dataplus._M_p != paVar1) {
      operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1
                     );
    }
    if (objs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&objs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(objs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((objs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar32) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)objPath._M_dataplus._M_p != &objPath.field_2) {
      operator_delete(objPath._M_dataplus._M_p,
                      CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                               objPath.field_2._M_local_buf[0]) + 1);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objPath,(this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(&postBuildCmdLine,pcVar14,&objPath);
  cmOutputConverter::ConvertToOutputFormat
            ((string *)&symlinkVars,
             &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &postBuildCmdLine,SHELL);
  rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"OBJECT_DIR","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&objPath);
  pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  if (pcVar14->UsingGCCOnWindows == true) {
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_LIBRARIES","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    sVar6 = pmVar20->_M_string_length;
    if (sVar6 != 0) {
      pcVar2 = (pmVar20->_M_dataplus)._M_p;
      sVar27 = 0;
      do {
        if (pcVar2[sVar27] == '\\') {
          pcVar2[sVar27] = '/';
        }
        sVar27 = sVar27 + 1;
      } while (sVar6 != sVar27);
    }
    symlinkVars._M_t._M_impl._0_8_ =
         &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>((string *)&symlinkVars,"LINK_PATH","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,(key_type *)&symlinkVars);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    sVar6 = pmVar20->_M_string_length;
    if (sVar6 != 0) {
      pcVar2 = (pmVar20->_M_dataplus)._M_p;
      sVar27 = 0;
      do {
        if (pcVar2[sVar27] == '\\') {
          pcVar2[sVar27] = '/';
        }
        sVar27 = sVar27 + 1;
      } while (sVar6 != sVar27);
    }
  }
  cmdLists[0] = cmGeneratorTarget::GetPreBuildCommands(this_01);
  cmdLists[1] = cmGeneratorTarget::GetPreLinkCommands(this_01);
  cmdLists[2] = cmGeneratorTarget::GetPostBuildCommands(this_01);
  lVar28 = 0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  preLinkCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  postBuildCmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLineLists[0] = &preLinkCmdLines;
  cmdLineLists[1] = &preLinkCmdLines;
  cmdLineLists[2] = &postBuildCmdLines;
  do {
    pvVar7 = cmdLists[lVar28];
    cc = (pvVar7->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
         super__Vector_impl_data._M_start;
    if (cc != (pvVar7->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
              _M_impl.super__Vector_impl_data._M_finish) {
      do {
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)&symlinkVars,cc,&cfgName,
                   (cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
        cmLocalNinjaGenerator::AppendCustomCommandLines
                  (this_03,(cmCustomCommandGenerator *)&symlinkVars,cmdLineLists[lVar28]);
        pvVar22 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&symlinkVars);
        __first._M_current =
             (pvVar22->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        __last._M_current =
             (pvVar22->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        __unary_op.GG =
             cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (__first,__last,&byproducts,__unary_op);
        cmCustomCommandGenerator::~cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)&symlinkVars);
        cc = cc + 1;
      } while (cc != (pvVar7->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)
                     ._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 3);
  psVar19 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_((cmCommonTargetGenerator *)this);
  source = cmGeneratorTarget::GetModuleDefinitionInfo(this_01,psVar19);
  if ((source != (ModuleDefinitionInfo *)0x0) && (source->DefFileGenerated == true)) {
    pcVar5 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar19 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    cmOutputConverter::ConvertToOutputFormat
              (&postBuildCmdLine,
               &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,psVar19,SHELL);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&rspfile,postBuildCmdLine._M_dataplus._M_p,
               postBuildCmdLine._M_dataplus._M_p + postBuildCmdLine._M_string_length);
    std::__cxx11::string::append((char *)&rspfile);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).super_cmLocalGenerator.super_cmOutputConverter,&source->DefFile,SHELL);
    std::__cxx11::string::_M_append((char *)&rspfile,symlinkVars._M_t._M_impl._0_8_);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    std::__cxx11::string::append((char *)&rspfile);
    obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
    pcVar2 = (source->DefFile)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&obj_list_file,pcVar2,pcVar2 + (source->DefFile)._M_string_length);
    std::__cxx11::string::append((char *)&obj_list_file);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&symlinkVars,
               &(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
                ).super_cmLocalGenerator.super_cmOutputConverter,&obj_list_file,SHELL);
    std::__cxx11::string::_M_append((char *)&rspfile,symlinkVars._M_t._M_impl._0_8_);
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&preLinkCmdLines,&rspfile);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&symlinkVars,obj_list_file._M_dataplus._M_p,false,None);
    if (source->WindowsExportAllSymbols == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&objs,__x);
      pbVar31 = objs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar33 = objs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          uVar8 = pbVar31->_M_string_length;
          if (3 < uVar8) {
            pcVar16 = (pbVar31->_M_dataplus)._M_p;
            iVar11 = strcmp(pcVar16 + (uVar8 - 4),".obj");
            if (iVar11 == 0) {
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&symlinkVars,pcVar16,uVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
              pbVar33 = objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          pbVar31 = pbVar31 + 1;
        } while (pbVar31 != pbVar33);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&objs);
    }
    ppcVar30 = (source->Sources).
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppcVar30 !=
        (source->Sources).
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        psVar19 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar30);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&symlinkVars,(psVar19->_M_dataplus)._M_p,
                             psVar19->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
        ppcVar30 = ppcVar30 + 1;
      } while (ppcVar30 !=
               (source->Sources).
               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&symlinkVars);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
      operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
  }
  paVar32 = &postBuildCmdLine.field_2;
  if (preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      preLinkCmdLines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar16 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this_03);
    std::__cxx11::string::string((string *)&postBuildCmdLine,pcVar16,(allocator *)&rspfile);
    cmOutputConverter::ConvertToOutputFormat((string *)&symlinkVars,this_00,&postBuildCmdLine,SHELL)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != paVar32) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    std::operator+(&postBuildCmdLine,"cd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&symlinkVars
                  );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&preLinkCmdLines
               ,&postBuildCmdLine);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)postBuildCmdLine._M_dataplus._M_p != paVar32) {
      operator_delete(postBuildCmdLine._M_dataplus._M_p,
                      CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                               postBuildCmdLine.field_2._M_local_buf[0]) + 1);
    }
    if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
        &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                      (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
  }
  cmLocalNinjaGenerator::BuildCommandLine((string *)&symlinkVars,this_03,&preLinkCmdLines);
  postBuildCmdLine._M_dataplus._M_p = (pointer)paVar32;
  std::__cxx11::string::_M_construct<char_const*>((string *)&postBuildCmdLine,"PRE_LINK","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&postBuildCmdLine);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&symlinkVars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != paVar32) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  paVar32 = &rspfile.field_2;
  if ((_Base_ptr *)symlinkVars._M_t._M_impl._0_8_ !=
      &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)symlinkVars._M_t._M_impl._0_8_,
                    (ulong)((long)&(symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  cmLocalNinjaGenerator::BuildCommandLine(&postBuildCmdLine,this_03,&postBuildCmdLines);
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symlinkVars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((targetOutput._M_string_length == targetOutputReal._M_string_length) &&
      ((targetOutput._M_string_length == 0 ||
       (iVar11 = bcmp(targetOutput._M_dataplus._M_p,targetOutputReal._M_dataplus._M_p,
                      targetOutput._M_string_length), iVar11 == 0)))) ||
     (bVar9 = cmGeneratorTarget::IsFrameworkOnApple(this_01), bVar9)) {
    rspfile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar32) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    bVar9 = false;
  }
  else {
    rspfile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar32) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    rspfile._M_dataplus._M_p = (pointer)paVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"POST_BUILD","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&symlinkVars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != paVar32) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    bVar9 = true;
  }
  pcVar14 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  iVar11 = std::__cxx11::string::compare((char *)psVar13);
  if ((iVar11 != 0) && (iVar11 = std::__cxx11::string::compare((char *)psVar13), iVar11 != 0)) {
    bVar10 = cmNinjaTargetGenerator::ForceResponseFile(&this->super_cmNinjaTargetGenerator);
    iVar11 = -1;
    if (bVar10) goto LAB_0036e94f;
  }
  sVar23 = cmSystemTools::CalculateCommandLineLengthLimit();
  LanguageLinkerRule_abi_cxx11_(&rspfile,this);
  pmVar24 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::operator[](&pcVar14->RuleCmdLength,&rspfile);
  iVar11 = (int)sVar23 - *pmVar24;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != paVar32) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
LAB_0036e94f:
  objs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&objs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&objs,"CMakeFiles/","");
  psVar13 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
  plVar21 = (long *)std::__cxx11::string::_M_append
                              ((char *)&objs,(ulong)(psVar13->_M_dataplus)._M_p);
  obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
  psVar26 = (size_type *)(plVar21 + 2);
  if ((size_type *)*plVar21 == psVar26) {
    obj_list_file.field_2._M_allocated_capacity = *psVar26;
    obj_list_file.field_2._8_8_ = plVar21[3];
  }
  else {
    obj_list_file.field_2._M_allocated_capacity = *psVar26;
    obj_list_file._M_dataplus._M_p = (pointer)*plVar21;
  }
  obj_list_file._M_string_length = plVar21[1];
  *plVar21 = (long)psVar26;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&obj_list_file);
  psVar26 = (size_type *)(plVar21 + 2);
  if ((size_type *)*plVar21 == psVar26) {
    rspfile.field_2._M_allocated_capacity = *psVar26;
    rspfile.field_2._8_8_ = plVar21[3];
    rspfile._M_dataplus._M_p = (pointer)paVar32;
  }
  else {
    rspfile.field_2._M_allocated_capacity = *psVar26;
    rspfile._M_dataplus._M_p = (pointer)*plVar21;
  }
  rspfile._M_string_length = plVar21[1];
  *plVar21 = (long)psVar26;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  if (objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&objs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(objs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orderOnlyDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmLocalNinjaGenerator::AppendTargetDepends
            ((this->super_cmNinjaTargetGenerator).LocalGenerator,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &orderOnlyDeps,DependOnTargetArtifact);
  pcVar16 = "";
  if (byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar16 = "1";
  }
  obj_list_file._M_dataplus._M_p = (pointer)&obj_list_file.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&obj_list_file,"RESTAT","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&obj_list_file);
  std::__cxx11::string::_M_replace
            ((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,(ulong)pcVar16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  pbVar31 = byproducts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      byproducts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar33 = byproducts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar25 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::SeenCustomCommandOutput(pcVar25,pbVar33);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&outputs,pbVar33);
      pbVar33 = pbVar33 + 1;
    } while (pbVar33 != pbVar31);
  }
  usedResponseFile = false;
  pcVar15 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::stringbuf::str();
  LanguageLinkerRule_abi_cxx11_((string *)&objs,this);
  local_6c8._M_dataplus._M_p = (pointer)0x0;
  local_6c8._M_string_length = 0;
  local_6c8.field_2._M_allocated_capacity = 0;
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar14,(ostream *)pcVar15,&obj_list_file,(string *)&objs,&outputs,
             (cmNinjaDeps *)&local_6c8,&explicitDeps,&implicitDeps,&orderOnlyDeps,&vars,&rspfile,
             iVar11,&usedResponseFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_6c8);
  if (objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&objs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(objs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((objs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  WriteLinkRule(this,usedResponseFile);
  if (bVar9) {
    if (targetType == EXECUTABLE) {
      pcVar15 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+(&obj_list_file,"Create executable symlink ",&targetOutput);
      objs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&objs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&objs,"CMAKE_SYMLINK_EXECUTABLE","")
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_348,1,&targetOutput,(allocator_type *)&local_1f8);
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_388,1,&targetOutputReal,&local_729);
      local_6c8._M_string_length = 0;
      local_6c8.field_2._M_allocated_capacity =
           local_6c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar14,(ostream *)pcVar15,&obj_list_file,(string *)&objs,(cmNinjaDeps *)local_348,
                 &symlinks,&local_388,&emptyDeps,&emptyDeps,&symlinkVars,&local_6c8,0,(bool *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
        operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_348);
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&objs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((objs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      symlinks.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmNinjaTargetGenerator::GetTargetFilePath
                ((string *)&objs,&this->super_cmNinjaTargetGenerator,&this->TargetNameSO);
      pcVar25 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::ConvertToNinjaPath(&obj_list_file,pcVar25,(string *)&objs);
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&objs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((objs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      sVar6 = obj_list_file._M_string_length;
      if (((targetOutputReal._M_string_length == obj_list_file._M_string_length) &&
          ((targetOutputReal._M_string_length == 0 ||
           (iVar11 = bcmp(targetOutputReal._M_dataplus._M_p,obj_list_file._M_dataplus._M_p,
                          targetOutputReal._M_string_length), iVar11 == 0)))) ||
         ((targetOutput._M_string_length == sVar6 &&
          ((sVar6 == 0 ||
           (iVar11 = bcmp(targetOutput._M_dataplus._M_p,obj_list_file._M_dataplus._M_p,sVar6),
           iVar11 == 0)))))) {
        objs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&objs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objs,"SONAME","");
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,(key_type *)&objs);
        std::__cxx11::string::_M_assign((string *)pmVar20);
        if (objs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&objs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(objs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((objs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
      }
      else {
        objs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&objs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>((string *)&objs,"SONAME","");
        pmVar20 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&symlinkVars,(key_type *)&objs);
        std::__cxx11::string::_M_replace
                  ((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,0x5944aa);
        if (objs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&objs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(objs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((objs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_dataplus)._M_p + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&symlinks,&obj_list_file);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&symlinks,&targetOutput);
      pcVar15 = cmNinjaTargetGenerator::GetBuildFileStream(&this->super_cmNinjaTargetGenerator);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&objs,
                     "Create library symlink ",&targetOutput);
      local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6c8,"CMAKE_SYMLINK_LIBRARY","");
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_388.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1f8,1,&targetOutputReal,&local_729);
      local_348._8_8_ = (pointer)0x0;
      local_348[0x10] = '\0';
      local_348._0_8_ = (pointer)(local_348 + 0x10);
      cmGlobalNinjaGenerator::WriteBuild
                (pcVar14,(ostream *)pcVar15,(string *)&objs,&local_6c8,&symlinks,&local_388,
                 &local_1f8,&emptyDeps,&emptyDeps,&symlinkVars,(string *)local_348,0,(bool *)0x0);
      if ((pointer)local_348._0_8_ != (pointer)(local_348 + 0x10)) {
        operator_delete((void *)local_348._0_8_,CONCAT71(local_348._17_7_,local_348[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
        operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
      }
      if (objs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&objs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(objs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((objs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
        operator_delete(obj_list_file._M_dataplus._M_p,
                        obj_list_file.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&symlinks);
    }
  }
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar14,&this->TargetNameOut,this_01);
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            (&obj_list_file,&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddTargetAlias(pcVar14,&obj_list_file,this_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)obj_list_file._M_dataplus._M_p != &obj_list_file.field_2) {
    operator_delete(obj_list_file._M_dataplus._M_p,obj_list_file.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&orderOnlyDeps);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&symlinkVars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)postBuildCmdLine._M_dataplus._M_p != &postBuildCmdLine.field_2) {
    operator_delete(postBuildCmdLine._M_dataplus._M_p,
                    CONCAT71(postBuildCmdLine.field_2._M_allocated_capacity._1_7_,
                             postBuildCmdLine.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&postBuildCmdLines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&preLinkCmdLines);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objPath._M_dataplus._M_p != &objPath.field_2) {
    operator_delete(objPath._M_dataplus._M_p,
                    CONCAT71(objPath.field_2._M_allocated_capacity._1_7_,
                             objPath.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&byproducts);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lwyuFlags._M_dataplus._M_p != &lwyuFlags.field_2) {
    operator_delete(lwyuFlags._M_dataplus._M_p,
                    CONCAT71(lwyuFlags.field_2._M_allocated_capacity._1_7_,
                             lwyuFlags.field_2._M_local_buf[0]) + 1);
  }
  (*this_04->_vptr_cmLinkLineComputer[1])();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)createRule._M_dataplus._M_p != &createRule.field_2) {
    operator_delete(createRule._M_dataplus._M_p,createRule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
    operator_delete(linkPath._M_dataplus._M_p,
                    CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                             linkPath.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
    operator_delete(frameworkPath._M_dataplus._M_p,
                    CONCAT71(frameworkPath.field_2._M_allocated_capacity._1_7_,
                             frameworkPath.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&comment);
  std::ios_base::~ios_base(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emptyDeps);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputImplib._M_dataplus._M_p != &targetOutputImplib.field_2) {
    operator_delete(targetOutputImplib._M_dataplus._M_p,
                    targetOutputImplib.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutputReal._M_dataplus._M_p != &targetOutputReal.field_2) {
    operator_delete(targetOutputReal._M_dataplus._M_p,
                    targetOutputReal.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetOutput._M_dataplus._M_p != &targetOutput.field_2) {
    operator_delete(targetOutput._M_dataplus._M_p,targetOutput.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cfgName._M_dataplus._M_p != &cfgName.field_2) {
    operator_delete(cfgName._M_dataplus._M_p,cfgName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkStatement()
{
  cmGeneratorTarget& gt = *this->GetGeneratorTarget();
  const std::string cfgName = this->GetConfigName();
  std::string targetOutput = ConvertToNinjaPath(gt.GetFullPath(cfgName));
  std::string targetOutputReal = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::RuntimeBinaryArtifact,
                   /*realname=*/true));
  std::string targetOutputImplib = ConvertToNinjaPath(
    gt.GetFullPath(cfgName, cmStateEnums::ImportLibraryArtifact));

  if (gt.IsAppBundleOnApple()) {
    // Create the app bundle
    std::string outpath = gt.GetDirectory(cfgName);
    this->OSXBundleGenerator->CreateAppBundle(this->TargetNameOut, outpath);

    // Calculate the output path
    targetOutput = outpath;
    targetOutput += "/";
    targetOutput += this->TargetNameOut;
    targetOutput = this->ConvertToNinjaPath(targetOutput);
    targetOutputReal = outpath;
    targetOutputReal += "/";
    targetOutputReal += this->TargetNameReal;
    targetOutputReal = this->ConvertToNinjaPath(targetOutputReal);
  } else if (gt.IsFrameworkOnApple()) {
    // Create the library framework.
    this->OSXBundleGenerator->CreateFramework(this->TargetNameOut,
                                              gt.GetDirectory(cfgName));
  } else if (gt.IsCFBundleOnApple()) {
    // Create the core foundation bundle.
    this->OSXBundleGenerator->CreateCFBundle(this->TargetNameOut,
                                             gt.GetDirectory(cfgName));
  }

  // Write comments.
  cmGlobalNinjaGenerator::WriteDivider(this->GetBuildFileStream());
  const cmStateEnums::TargetType targetType = gt.GetType();
  this->GetBuildFileStream() << "# Link build statements for "
                             << cmState::GetTargetTypeName(targetType)
                             << " target " << this->GetTargetName() << "\n\n";

  cmNinjaDeps emptyDeps;
  cmNinjaVars vars;

  // Compute the comment.
  std::ostringstream comment;
  comment << "Link the " << this->GetVisibleTypeName() << " "
          << targetOutputReal;

  // Compute outputs.
  cmNinjaDeps outputs;
  outputs.push_back(targetOutputReal);

  // Compute specific libraries to link with.
  cmNinjaDeps explicitDeps = this->GetObjects();
  cmNinjaDeps implicitDeps = this->ComputeLinkDeps();

  if (!this->DeviceLinkObject.empty()) {
    explicitDeps.push_back(this->DeviceLinkObject);
  }

  cmMakefile* mf = this->GetMakefile();

  std::string frameworkPath;
  std::string linkPath;
  cmGeneratorTarget& genTarget = *this->GetGeneratorTarget();

  std::string createRule = genTarget.GetCreateRuleVariable(
    this->TargetLinkLanguage, this->GetConfigName());
  bool useWatcomQuote = mf->IsOn(createRule + "_USE_WATCOM_QUOTE");
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(targetOutputReal, cmOutputConverter::SHELL);

  CM_AUTO_PTR<cmLinkLineComputer> linkLineComputer(
    this->GetGlobalGenerator()->CreateLinkLineComputer(
      this->GetLocalGenerator(),
      this->GetLocalGenerator()->GetStateSnapshot().GetDirectory()));
  linkLineComputer->SetUseWatcomQuote(useWatcomQuote);

  localGen.GetTargetFlags(
    linkLineComputer.get(), this->GetConfigName(), vars["LINK_LIBRARIES"],
    vars["FLAGS"], vars["LINK_FLAGS"], frameworkPath, linkPath, &genTarget);

  // Add OS X version flags, if any.
  if (this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "COMPATIBILITY", true);
    this->AppendOSXVerFlag(vars["LINK_FLAGS"], this->TargetLinkLanguage,
                           "CURRENT", false);
  }

  this->addPoolNinjaVariable("JOB_POOL_LINK", &gt, vars);

  this->AddModuleDefinitionFlag(linkLineComputer.get(), vars["LINK_FLAGS"]);
  vars["LINK_FLAGS"] =
    cmGlobalNinjaGenerator::EncodeLiteral(vars["LINK_FLAGS"]);

  vars["MANIFESTS"] = this->GetManifests();

  vars["LINK_PATH"] = frameworkPath + linkPath;
  std::string lwyuFlags;
  if (genTarget.GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
    lwyuFlags = " -Wl,--no-as-needed";
  }

  // Compute architecture specific link flags.  Yes, these go into a different
  // variable for executables, probably due to a mistake made when duplicating
  // code between the Makefile executable and library generators.
  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string t = vars["FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, TargetLinkLanguage, cfgName);
    t += lwyuFlags;
    vars["FLAGS"] = t;
  } else {
    std::string t = vars["ARCH_FLAGS"];
    localGen.AddArchitectureFlags(t, &genTarget, TargetLinkLanguage, cfgName);
    vars["ARCH_FLAGS"] = t;
    t = "";
    t += lwyuFlags;
    localGen.AddLanguageFlagsForLinking(t, &genTarget, TargetLinkLanguage,
                                        cfgName);
    vars["LANGUAGE_COMPILE_FLAGS"] = t;
  }
  if (this->GetGeneratorTarget()->HasSOName(cfgName)) {
    vars["SONAME_FLAG"] = mf->GetSONameFlag(this->TargetLinkLanguage);
    vars["SONAME"] = this->TargetNameSO;
    if (targetType == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(cfgName);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  cmNinjaDeps byproducts;

  if (!this->TargetNameImport.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    EnsureParentDirectoryExists(impLibPath);
    if (genTarget.HasImportLibrary()) {
      byproducts.push_back(targetOutputImplib);
    }
  }

  if (!this->SetMsvcTargetPdbVariable(vars)) {
    // It is common to place debug symbols at a specific place,
    // so we need a plain target name in the rule available.
    std::string prefix;
    std::string base;
    std::string suffix;
    this->GetGeneratorTarget()->GetFullNameComponents(prefix, base, suffix);
    std::string dbg_suffix = ".dbg";
    // TODO: Where to document?
    if (mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX")) {
      dbg_suffix = mf->GetDefinition("CMAKE_DEBUG_SYMBOL_SUFFIX");
    }
    vars["TARGET_PDB"] = base + suffix + dbg_suffix;
  }

  const std::string objPath = GetGeneratorTarget()->GetSupportDirectory();
  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  EnsureDirectoryExists(objPath);

  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::string& linkLibraries = vars["LINK_LIBRARIES"];
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::string& link_path = vars["LINK_PATH"];
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  const std::vector<cmCustomCommand>* cmdLists[3] = {
    &gt.GetPreBuildCommands(), &gt.GetPreLinkCommands(),
    &gt.GetPostBuildCommands()
  };

  std::vector<std::string> preLinkCmdLines, postBuildCmdLines;
  std::vector<std::string>* cmdLineLists[3] = { &preLinkCmdLines,
                                                &preLinkCmdLines,
                                                &postBuildCmdLines };

  for (unsigned i = 0; i != 3; ++i) {
    for (std::vector<cmCustomCommand>::const_iterator ci =
           cmdLists[i]->begin();
         ci != cmdLists[i]->end(); ++ci) {
      cmCustomCommandGenerator ccg(*ci, cfgName, this->GetLocalGenerator());
      localGen.AppendCustomCommandLines(ccg, *cmdLineLists[i]);
      std::vector<std::string> const& ccByproducts = ccg.GetByproducts();
      std::transform(ccByproducts.begin(), ccByproducts.end(),
                     std::back_inserter(byproducts), MapToNinjaPath());
    }
  }

  // maybe create .def file from list of objects
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    gt.GetModuleDefinitionInfo(this->GetConfigName());
  if (mdi && mdi->DefFileGenerated) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    std::string cmd = cmakeCommand;
    cmd += " -E __create_def ";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      mdi->DefFile, cmOutputConverter::SHELL);
    cmd += " ";
    std::string obj_list_file = mdi->DefFile + ".objs";
    cmd += this->GetLocalGenerator()->ConvertToOutputFormat(
      obj_list_file, cmOutputConverter::SHELL);
    preLinkCmdLines.push_back(cmd);

    // create a list of obj files for the -E __create_def to read
    cmGeneratedFileStream fout(obj_list_file.c_str());

    if (mdi->WindowsExportAllSymbols) {
      cmNinjaDeps objs = this->GetObjects();
      for (cmNinjaDeps::iterator i = objs.begin(); i != objs.end(); ++i) {
        if (cmHasLiteralSuffix(*i, ".obj")) {
          fout << *i << "\n";
        }
      }
    }

    for (std::vector<cmSourceFile const*>::const_iterator i =
           mdi->Sources.begin();
         i != mdi->Sources.end(); ++i) {
      fout << (*i)->GetFullPath() << "\n";
    }
  }
  // If we have any PRE_LINK commands, we need to go back to CMAKE_BINARY_DIR
  // for
  // the link commands.
  if (!preLinkCmdLines.empty()) {
    const std::string homeOutDir = localGen.ConvertToOutputFormat(
      localGen.GetBinaryDirectory(), cmOutputConverter::SHELL);
    preLinkCmdLines.push_back("cd " + homeOutDir);
  }

  vars["PRE_LINK"] = localGen.BuildCommandLine(preLinkCmdLines);
  std::string postBuildCmdLine = localGen.BuildCommandLine(postBuildCmdLines);

  cmNinjaVars symlinkVars;
  bool const symlinkNeeded =
    (targetOutput != targetOutputReal && !gt.IsFrameworkOnApple());
  if (!symlinkNeeded) {
    vars["POST_BUILD"] = postBuildCmdLine;
  } else {
    vars["POST_BUILD"] = cmGlobalNinjaGenerator::SHELL_NOOP;
    symlinkVars["POST_BUILD"] = postBuildCmdLine;
  }
  cmGlobalNinjaGenerator& globalGen = *this->GetGlobalGenerator();

  bool const lang_supports_response =
    !(this->TargetLinkLanguage == "RC" || this->TargetLinkLanguage == "CUDA");
  int commandLineLengthLimit = -1;
  if (!lang_supports_response || !this->ForceResponseFile()) {
    commandLineLengthLimit =
      static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
      globalGen.GetRuleCmdLength(this->LanguageLinkerRule());
  }

  const std::string rspfile =
    std::string(cmake::GetCMakeFilesDirectoryPostSlash()) + gt.GetName() +
    ".rsp";

  // Gather order-only dependencies.
  cmNinjaDeps orderOnlyDeps;
  this->GetLocalGenerator()->AppendTargetDepends(this->GetGeneratorTarget(),
                                                 orderOnlyDeps);

  // Ninja should restat after linking if and only if there are byproducts.
  vars["RESTAT"] = byproducts.empty() ? "" : "1";

  for (cmNinjaDeps::const_iterator oi = byproducts.begin(),
                                   oe = byproducts.end();
       oi != oe; ++oi) {
    this->GetGlobalGenerator()->SeenCustomCommandOutput(*oi);
    outputs.push_back(*oi);
  }

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen.WriteBuild(this->GetBuildFileStream(), comment.str(),
                       this->LanguageLinkerRule(), outputs,
                       /*implicitOuts=*/cmNinjaDeps(), explicitDeps,
                       implicitDeps, orderOnlyDeps, vars, rspfile,
                       commandLineLengthLimit, &usedResponseFile);
  this->WriteLinkRule(usedResponseFile);

  if (symlinkNeeded) {
    if (targetType == cmStateEnums::EXECUTABLE) {
      globalGen.WriteBuild(
        this->GetBuildFileStream(),
        "Create executable symlink " + targetOutput,
        "CMAKE_SYMLINK_EXECUTABLE", cmNinjaDeps(1, targetOutput),
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    } else {
      cmNinjaDeps symlinks;
      std::string const soName =
        this->ConvertToNinjaPath(this->GetTargetFilePath(this->TargetNameSO));
      // If one link has to be created.
      if (targetOutputReal == soName || targetOutput == soName) {
        symlinkVars["SONAME"] = soName;
      } else {
        symlinkVars["SONAME"] = "";
        symlinks.push_back(soName);
      }
      symlinks.push_back(targetOutput);
      globalGen.WriteBuild(
        this->GetBuildFileStream(), "Create library symlink " + targetOutput,
        "CMAKE_SYMLINK_LIBRARY", symlinks,
        /*implicitOuts=*/cmNinjaDeps(), cmNinjaDeps(1, targetOutputReal),
        emptyDeps, emptyDeps, symlinkVars);
    }
  }

  // Add aliases for the file name and the target name.
  globalGen.AddTargetAlias(this->TargetNameOut, &gt);
  globalGen.AddTargetAlias(this->GetTargetName(), &gt);
}